

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddConstraint
          (ConstraintSet *this,uint body_id,Vector3d *body_point,Vector3d *world_normal,
          char *constraint_name,double normal_acceleration)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  string name_str;
  allocator_type local_95;
  uint local_94;
  double local_90;
  value_type local_88;
  value_type local_68;
  _Vector_base<Vector3_t,_std::allocator<Vector3_t>_> local_50;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_38 [8];
  undefined8 local_30;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_94 = body_id;
  local_90 = normal_acceleration;
  if (constraint_name != (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 8),&local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x20),&local_94);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x38),body_point);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x50),world_normal);
  uVar2 = *(ulong *)(this + 0x70);
  uVar1 = (uint)uVar2;
  __n = (ulong)(uVar1 + 1);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x68),__n);
  uVar2 = uVar2 & 0xffffffff;
  *(double *)(*(long *)(this + 0x68) + uVar2 * 8) = local_90;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x78),__n);
  *(undefined8 *)(*(long *)(this + 0x78) + uVar2 * 8) = 0;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x88),__n);
  *(undefined8 *)(*(long *)(this + 0x88) + uVar2 * 8) = 0;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x98),__n);
  *(undefined8 *)(*(long *)(this + 0x98) + uVar2 * 8) = 0;
  local_30 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_68,local_38);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)&local_50,__n,&local_68,&local_95);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_move_assign
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x2e8),&local_50);
  std::_Vector_base<Vector3_t,_std::allocator<Vector3_t>_>::~_Vector_base(&local_50);
  std::__cxx11::string::~string((string *)&local_88);
  return uVar1;
}

Assistant:

unsigned int ConstraintSet::AddConstraint (
		unsigned int body_id,
		const Vector3d &body_point,
		const Vector3d &world_normal,
		const char *constraint_name,
		double normal_acceleration) {
	assert (bound == false);

	std::string name_str;
	if (constraint_name != NULL)
		name_str = constraint_name;

	name.push_back (name_str);
	body.push_back (body_id);
	point.push_back (body_point);
	normal.push_back (world_normal);

	unsigned int n_constr = acceleration.size() + 1;

	acceleration.conservativeResize (n_constr);
	acceleration[n_constr - 1] = normal_acceleration;

	force.conservativeResize (n_constr);
	force[n_constr - 1] = 0.;

	impulse.conservativeResize (n_constr);
	impulse[n_constr - 1] = 0.;

	v_plus.conservativeResize (n_constr);
	v_plus[n_constr - 1] = 0.;

	d_multdof3_u = std::vector<Math::Vector3d> (n_constr, Math::Vector3d::Zero());

	return n_constr - 1;
}